

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_code.hpp
# Opt level: O0

bool __thiscall
boost::system::error_category::std_category::equivalent
          (std_category *this,int code,error_condition *condition)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  error_category *peVar4;
  error_category *__other;
  error_condition *__lhs;
  error_category *peVar5;
  error_condition *in_RDX;
  undefined4 in_ESI;
  error_category *in_RDI;
  error_condition bn_2;
  std_category *pc2;
  error_condition bn_1;
  error_condition bn;
  long local_98;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  error_condition local_58;
  long local_48;
  error_condition local_40;
  error_condition local_30;
  error_condition *local_20;
  undefined4 local_14;
  bool local_1;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  peVar4 = std::error_condition::category(in_RDX);
  bVar1 = std::_V2::error_category::operator==(peVar4,in_RDI);
  if (bVar1) {
    iVar3 = std::error_condition::value(local_20);
    error_condition::error_condition(&local_30,iVar3,*(error_category **)(in_RDI + 8));
    bVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x28))(*(long **)(in_RDI + 8),local_14,&local_30)
    ;
  }
  else {
    peVar4 = std::error_condition::category(local_20);
    __other = (error_category *)std::_V2::generic_category();
    bVar1 = std::_V2::error_category::operator==(peVar4,__other);
    if (!bVar1) {
      __lhs = (error_condition *)std::error_condition::category(local_20);
      peVar5 = generic_category();
      peVar4 = operator_cast_to_error_category_(peVar5);
      bVar1 = std::_V2::error_category::operator==((error_category *)__lhs,peVar4);
      if (!bVar1) {
        peVar4 = std::error_condition::category(local_20);
        if (peVar4 == (error_category *)0x0) {
          local_98 = 0;
        }
        else {
          local_98 = __dynamic_cast(peVar4,&std::_V2::error_category::typeinfo,&typeinfo,0);
        }
        local_48 = local_98;
        if (local_98 != 0) {
          iVar3 = std::error_condition::value(local_20);
          error_condition::error_condition(&local_58,iVar3,*(error_category **)(local_48 + 8));
          bVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x28))
                            (*(long **)(in_RDI + 8),local_14,&local_58);
          return (bool)(bVar2 & 1);
        }
        (**(code **)(*(long *)in_RDI + 0x28))(in_RDI,local_14);
        bVar1 = std::operator==(__lhs,(error_condition *)
                                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
        ;
        return bVar1;
      }
    }
    iVar3 = std::error_condition::value(local_20);
    peVar5 = generic_category();
    error_condition::error_condition(&local_40,iVar3,peVar5);
    bVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x28))(*(long **)(in_RDI + 8),local_14,&local_40)
    ;
  }
  local_1 = (bool)(bVar2 & 1);
  return local_1;
}

Assistant:

inline bool error_category::std_category::equivalent( int code,
      const std::error_condition & condition ) const BOOST_NOEXCEPT
    {
      if( condition.category() == *this )
      {
        boost::system::error_condition bn( condition.value(), *pc_ );
        return pc_->equivalent( code, bn );
      }
      else if( condition.category() == std::generic_category()
        || condition.category() == boost::system::generic_category() )
      {
        boost::system::error_condition bn( condition.value(),
          boost::system::generic_category() );

        return pc_->equivalent( code, bn );
      }
#ifndef BOOST_NO_RTTI
      else if( std_category const* pc2 = dynamic_cast< std_category const* >(
        &condition.category() ) )
      {
        boost::system::error_condition bn( condition.value(), *pc2->pc_ );
        return pc_->equivalent( code, bn );
      }
#endif
      else
      {
        return default_error_condition( code ) == condition;
      }
    }